

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.cpp
# Opt level: O0

void Kernel::PrecedenceOrdering::checkLevelAssumptions(DArray<int> *levels)

{
  DArray<int> *levels_local;
  
  return;
}

Assistant:

void PrecedenceOrdering::checkLevelAssumptions(DArray<int> const& levels)
{
#if VDEBUG
  for (unsigned i = 0; i < levels.size(); i++) {
    if (theory->isInterpretedPredicate(i)) {
      auto itp = theory->interpretPredicate(i);
      if (itp == Kernel::Theory::EQUAL) {
        ASS_EQ(levels[i], PredLevels::EQ);
      } else if (theory->isInequality(itp)) {
      } else {
        ASS(levels[i] >= PredLevels::MIN_USER_DEF || levels[i] < 0)
      }
    }
  }
#endif // VDEBUG
}